

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ResizeBilinearLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_resizebilinear(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xd3) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xd3;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    ResizeBilinearLayerParams::ResizeBilinearLayerParams(this_00.resizebilinear_);
    (this->layer_).resizebilinear_ = (ResizeBilinearLayerParams *)this_00;
  }
  return (ResizeBilinearLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ResizeBilinearLayerParams* NeuralNetworkLayer::mutable_resizebilinear() {
  if (!has_resizebilinear()) {
    clear_layer();
    set_has_resizebilinear();
    layer_.resizebilinear_ = new ::CoreML::Specification::ResizeBilinearLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.resizeBilinear)
  return layer_.resizebilinear_;
}